

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pose.cc
# Opt level: O3

Vector6d *
gmath::combineError(Vector6d *__return_storage_ptr__,Vector6d *pose0,Vector6d *pose1,
                   Vector6d *pose0_err,Vector6d *pose1_err)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  long lVar7;
  int i;
  long lVar8;
  int i_1;
  int i_2;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar14;
  undefined1 auVar13 [16];
  Vector6d p;
  Vector6d pose;
  undefined1 local_c8 [40];
  double dStack_a0;
  Vector6d local_98;
  Vector6d local_68;
  
  combine(&local_68,pose0,pose1);
  __return_storage_ptr__->v[4] = 0.0;
  __return_storage_ptr__->v[5] = 0.0;
  __return_storage_ptr__->v[2] = 0.0;
  __return_storage_ptr__->v[3] = 0.0;
  __return_storage_ptr__->v[0] = 0.0;
  __return_storage_ptr__->v[1] = 0.0;
  lVar8 = 0;
  do {
    dStack_a0 = pose0->v[5];
    local_c8._16_8_ = pose0->v[2];
    local_c8._24_16_ = *(undefined1 (*) [16])(pose0->v + 3);
    local_c8._0_8_ = pose0->v[0];
    local_c8._8_8_ = pose0->v[1];
    *(double *)(local_c8 + lVar8 * 8) = pose0_err->v[lVar8] + *(double *)(local_c8 + lVar8 * 8);
    combine(&local_98,(Vector6d *)local_c8,pose1);
    dVar3 = local_98.v[3] - local_68.v[3];
    dVar4 = local_98.v[4] - local_68.v[4];
    dStack_a0 = local_98.v[5] - local_68.v[5];
    if (local_98.v[5] * local_68.v[5] +
        local_98.v[3] * local_68.v[3] + local_98.v[4] * local_68.v[4] < 0.0) {
      dVar6 = SQRT(local_98.v[5] * local_98.v[5] +
                   local_98.v[3] * local_98.v[3] + local_98.v[4] * local_98.v[4]);
      dVar9 = dVar6 + -6.283185307179586;
      auVar11._0_8_ = dVar9 * local_98.v[3];
      auVar11._8_8_ = dVar9 * local_98.v[4];
      auVar12._8_4_ = SUB84(dVar6,0);
      auVar12._0_8_ = dVar6;
      auVar12._12_4_ = (int)((ulong)dVar6 >> 0x20);
      auVar12 = divpd(auVar11,auVar12);
      dVar10 = auVar12._0_8_ - local_68.v[3];
      dVar14 = auVar12._8_8_ - local_68.v[4];
      dVar6 = (local_98.v[5] * dVar9) / dVar6 - local_68.v[5];
      if (dVar6 * dVar6 + dVar10 * dVar10 + dVar14 * dVar14 <
          dStack_a0 * dStack_a0 + dVar3 * dVar3 + dVar4 * dVar4) {
        dVar3 = dVar10;
        dVar4 = dVar14;
        dStack_a0 = dVar6;
      }
    }
    local_c8._0_8_ = local_98.v[0] - local_68.v[0];
    local_c8._8_8_ = local_98.v[1] - local_68.v[1];
    local_c8._16_8_ = local_98.v[2] - local_68.v[2];
    local_c8._32_4_ = SUB84(dVar4,0);
    local_c8._24_8_ = dVar3;
    local_c8._36_4_ = (int)((ulong)dVar4 >> 0x20);
    lVar7 = 0;
    do {
      dVar3 = *(double *)(local_c8 + lVar7 * 8 + 8) * *(double *)(local_c8 + lVar7 * 8 + 8) +
              (__return_storage_ptr__->v + lVar7)[1];
      auVar1._8_4_ = SUB84(dVar3,0);
      auVar1._0_8_ = *(double *)(local_c8 + lVar7 * 8) * *(double *)(local_c8 + lVar7 * 8) +
                     __return_storage_ptr__->v[lVar7];
      auVar1._12_4_ = (int)((ulong)dVar3 >> 0x20);
      *(undefined1 (*) [16])(__return_storage_ptr__->v + lVar7) = auVar1;
      lVar7 = lVar7 + 2;
    } while (lVar7 != 6);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 6);
  lVar8 = 0;
  do {
    dStack_a0 = pose1->v[5];
    local_c8._16_8_ = pose1->v[2];
    local_c8._24_16_ = *(undefined1 (*) [16])(pose1->v + 3);
    local_c8._0_8_ = pose1->v[0];
    local_c8._8_8_ = pose1->v[1];
    *(double *)(local_c8 + lVar8 * 8) = pose1_err->v[lVar8] + *(double *)(local_c8 + lVar8 * 8);
    combine(&local_98,pose0,(Vector6d *)local_c8);
    dVar3 = local_98.v[3] - local_68.v[3];
    dVar4 = local_98.v[4] - local_68.v[4];
    dStack_a0 = local_98.v[5] - local_68.v[5];
    if (local_98.v[5] * local_68.v[5] +
        local_98.v[3] * local_68.v[3] + local_98.v[4] * local_68.v[4] < 0.0) {
      dVar6 = SQRT(local_98.v[5] * local_98.v[5] +
                   local_98.v[3] * local_98.v[3] + local_98.v[4] * local_98.v[4]);
      dVar9 = dVar6 + -6.283185307179586;
      auVar13._0_8_ = dVar9 * local_98.v[3];
      auVar13._8_8_ = dVar9 * local_98.v[4];
      auVar5._8_4_ = SUB84(dVar6,0);
      auVar5._0_8_ = dVar6;
      auVar5._12_4_ = (int)((ulong)dVar6 >> 0x20);
      auVar12 = divpd(auVar13,auVar5);
      dVar10 = auVar12._0_8_ - local_68.v[3];
      dVar14 = auVar12._8_8_ - local_68.v[4];
      dVar6 = (local_98.v[5] * dVar9) / dVar6 - local_68.v[5];
      if (dVar6 * dVar6 + dVar10 * dVar10 + dVar14 * dVar14 <
          dStack_a0 * dStack_a0 + dVar3 * dVar3 + dVar4 * dVar4) {
        dVar3 = dVar10;
        dVar4 = dVar14;
        dStack_a0 = dVar6;
      }
    }
    local_c8._0_8_ = local_98.v[0] - local_68.v[0];
    local_c8._8_8_ = local_98.v[1] - local_68.v[1];
    local_c8._16_8_ = local_98.v[2] - local_68.v[2];
    local_c8._32_4_ = SUB84(dVar4,0);
    local_c8._24_8_ = dVar3;
    local_c8._36_4_ = (int)((ulong)dVar4 >> 0x20);
    lVar7 = 0;
    do {
      dVar3 = *(double *)(local_c8 + lVar7 * 8 + 8) * *(double *)(local_c8 + lVar7 * 8 + 8) +
              (__return_storage_ptr__->v + lVar7)[1];
      auVar2._8_4_ = SUB84(dVar3,0);
      auVar2._0_8_ = *(double *)(local_c8 + lVar7 * 8) * *(double *)(local_c8 + lVar7 * 8) +
                     __return_storage_ptr__->v[lVar7];
      auVar2._12_4_ = (int)((ulong)dVar3 >> 0x20);
      *(undefined1 (*) [16])(__return_storage_ptr__->v + lVar7) = auVar2;
      lVar7 = lVar7 + 2;
    } while (lVar7 != 6);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 6);
  lVar8 = 0;
  do {
    dVar3 = __return_storage_ptr__->v[lVar8];
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    __return_storage_ptr__->v[lVar8] = dVar3;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 6);
  return __return_storage_ptr__;
}

Assistant:

Vector6d combineError(const Vector6d &pose0, const Vector6d &pose1,
                      const Vector6d &pose0_err, const Vector6d &pose1_err)
{
  Vector6d pose=combine(pose0, pose1);
  Vector6d perr;

  for (int i=0; i<6; i++)
  {
    Vector6d p=pose0;
    p[i]+=pose0_err[i];

    p=diff(combine(p, pose1), pose);

    for (int k=0; k<6; k++)
    {
      perr[k]+=p[k]*p[k];
    }
  }

  for (int i=0; i<6; i++)
  {
    Vector6d p=pose1;
    p[i]+=pose1_err[i];

    p=diff(combine(pose0, p), pose);

    for (int k=0; k<6; k++)
    {
      perr[k]+=p[k]*p[k];
    }
  }

  for (int i=0; i<6; i++)
  {
    perr[i]=sqrt(perr[i]);
  }

  return perr;
}